

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O1

int32_t duckdb::TimeBucket::EpochMonths<duckdb::timestamp_t>(timestamp_t ts)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  undefined1 auVar4 [16];
  date_t result;
  date_t in_stack_ffffffffffffffbc;
  date_t local_3c;
  string local_38;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::date_t>(ts,&local_3c,false);
  if (bVar1) {
    iVar2 = Date::ExtractYear(in_stack_ffffffffffffffbc);
    iVar3 = Date::ExtractMonth(local_3c);
    return iVar3 + iVar2 * 0xc + -0x5c59;
  }
  auVar4 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::timestamp_t,duckdb::date_t>
            (&local_38,(duckdb *)ts.value,(timestamp_t)auVar4._8_8_);
  InvalidInputException::InvalidInputException(auVar4._0_8_,(string *)&local_38);
  __cxa_throw(auVar4._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline int32_t EpochMonths(T ts) {
		date_t ts_date = Cast::template Operation<T, date_t>(ts);
		return (Date::ExtractYear(ts_date) - 1970) * 12 + Date::ExtractMonth(ts_date) - 1;
	}